

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_tlbwe_40x(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_ptr pTVar1;
  TCGv_i64 pTVar2;
  uint32_t uVar3;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->pr & 1U) == 0) {
    uVar3 = rB(ctx->opcode);
    if (uVar3 == 0) {
      pTVar1 = tcg_ctx_00->cpu_env;
      uVar3 = rA(ctx->opcode);
      pTVar2 = cpu_gpr[uVar3];
      uVar3 = rS(ctx->opcode);
      gen_helper_4xx_tlbwe_hi(tcg_ctx_00,pTVar1,pTVar2,cpu_gpr[uVar3]);
    }
    else if (uVar3 == 1) {
      pTVar1 = tcg_ctx_00->cpu_env;
      uVar3 = rA(ctx->opcode);
      pTVar2 = cpu_gpr[uVar3];
      uVar3 = rS(ctx->opcode);
      gen_helper_4xx_tlbwe_lo(tcg_ctx_00,pTVar1,pTVar2,cpu_gpr[uVar3]);
    }
    else {
      gen_inval_exception(ctx,1);
    }
  }
  else {
    gen_priv_exception(ctx,1);
  }
  return;
}

Assistant:

static void gen_tlbwe_40x(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CHK_SV;

    switch (rB(ctx->opcode)) {
    case 0:
        gen_helper_4xx_tlbwe_hi(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rA(ctx->opcode)],
                                cpu_gpr[rS(ctx->opcode)]);
        break;
    case 1:
        gen_helper_4xx_tlbwe_lo(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rA(ctx->opcode)],
                                cpu_gpr[rS(ctx->opcode)]);
        break;
    default:
        gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
        break;
    }
}